

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Targa.cpp
# Opt level: O0

void __thiscall
TargaImage::TargaImage(TargaImage *this,char *name,int width,int height,char *comment)

{
  undefined1 auVar1 [16];
  FILE *fp_00;
  FileDataSink *this_00;
  ulong uVar2;
  ulong uVar3;
  rgb *prVar4;
  size_t sVar5;
  rgb *local_78;
  FILE *fp;
  char *comment_local;
  int height_local;
  int width_local;
  char *name_local;
  TargaImage *this_local;
  
  Image::Image(&this->super_Image);
  (this->super_Image)._vptr_Image = (_func_int **)&PTR__TargaImage_00110bf0;
  fp_00 = fopen(name,"w");
  this_00 = (FileDataSink *)operator_new(0x10);
  libssio::FileDataSink::FileDataSink(this_00,(FILE *)fp_00);
  this->file = this_00;
  this->buf_size = 1000;
  uVar2 = (ulong)this->buf_size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(3),0);
  if (SUB168(auVar1 * ZEXT816(3),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  prVar4 = (rgb *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_78 = prVar4;
    do {
      rgb::rgb(local_78,'\0');
      local_78 = local_78 + 1;
    } while (local_78 != prVar4 + uVar2);
  }
  this->buffer = prVar4;
  this->pos = 0;
  memset(&this->hdr,0,0x14);
  (this->hdr).data_type = '\x02';
  (this->hdr).width = (short)width;
  (this->hdr).height = (short)height;
  (this->hdr).data_bits = '\x18';
  (this->hdr).im_type = ' ';
  if (comment != (char *)0x0) {
    sVar5 = strlen(comment);
    (this->hdr).text_size = (char)sVar5 + '\x01';
  }
  targa_header::save(&this->hdr,&this->file->super_DataSink);
  if ('\0' < (this->hdr).text_size) {
    (*(this->file->super_DataSink)._vptr_DataSink[0xb])
              (this->file,comment,(ulong)(uint)(int)(this->hdr).text_size);
  }
  return;
}

Assistant:

TargaImage::TargaImage( char const*name, int width, int height, char *comment )
{
    FILE *fp = fopen(name, "w");
    file = new FileDataSink(fp);
    buf_size = 1000;
    buffer = new rgb [buf_size];
    pos = 0;

    memset(  &hdr, 0, sizeof(hdr) );
    hdr.data_type =   2;
    hdr.width = width;
    hdr.height = height;
    hdr.data_bits =   24;
    hdr.im_type = 32;

    if(comment) hdr.text_size = strlen(comment)+1;

    hdr.save(*file);

    if(hdr.text_size > 0) file->write(comment, hdr.text_size);
}